

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void gflags::anon_unknown_2::RegisterCommandLineFlag
               (char *name,char *help,char *filename,FlagValue *current,FlagValue *defvalue)

{
  CommandLineFlag *this;
  FlagRegistry *this_00;
  CommandLineFlag *flag;
  FlagValue *defvalue_local;
  FlagValue *current_local;
  char *filename_local;
  char *help_local;
  char *name_local;
  
  filename_local = help;
  if (help == (char *)0x0) {
    filename_local = "";
  }
  this = (CommandLineFlag *)operator_new(0x38);
  CommandLineFlag::CommandLineFlag(this,name,filename_local,filename,current,defvalue);
  this_00 = FlagRegistry::GlobalRegistry();
  FlagRegistry::RegisterFlag(this_00,this);
  return;
}

Assistant:

void RegisterCommandLineFlag(const char* name,
                             const char* help,
                             const char* filename,
                             FlagValue* current,
                             FlagValue* defvalue) {
  if (help == NULL)
    help = "";
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag =
      new CommandLineFlag(name, help, filename, current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);  // default registry
}